

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall icu_63::DecimalFormat::setupFastFormat(DecimalFormat *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  UBool UVar5;
  UBool UVar6;
  UBool UVar7;
  int8_t iVar8;
  char16_t cVar9;
  int32_t iVar10;
  uint uVar11;
  int iVar12;
  DecimalFormatProperties *pDVar13;
  DecimalFormatSymbols *pDVar14;
  UnicodeString *this_00;
  UnicodeString *this_01;
  byte bVar15;
  UChar32 codePointZero;
  UnicodeString *minusSignString;
  int32_t minFrac;
  int32_t maxInt;
  int32_t minInt;
  UnicodeString *groupingString;
  bool unusualGroupingSize;
  int32_t groupingSize;
  bool groupingUsed;
  UBool trivialNS;
  UBool trivialNP;
  UBool trivialPS;
  UBool trivialPP;
  DecimalFormat *this_local;
  
  pDVar13 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                      ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                       this->fields);
  bVar4 = icu_63::number::impl::DecimalFormatProperties::equalsDefaultExceptFastFormat(pDVar13);
  if (bVar4) {
    pDVar13 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                        ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                         this->fields);
    UVar5 = UnicodeString::isEmpty(&pDVar13->positivePrefixPattern);
    pDVar13 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                        ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                         this->fields);
    UVar6 = UnicodeString::isEmpty(&pDVar13->positiveSuffixPattern);
    pDVar13 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                        ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                         this->fields);
    UVar7 = UnicodeString::isBogus(&pDVar13->negativePrefixPattern);
    bVar4 = true;
    if (UVar7 == '\0') {
      pDVar13 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                          ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                           this->fields);
      iVar10 = UnicodeString::length(&pDVar13->negativePrefixPattern);
      bVar4 = false;
      if (iVar10 == 1) {
        pDVar13 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                            ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                             this->fields);
        cVar9 = UnicodeString::charAt(&pDVar13->negativePrefixPattern,0);
        bVar4 = cVar9 == L'-';
      }
    }
    pDVar13 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                        ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                         this->fields);
    UVar7 = UnicodeString::isEmpty(&pDVar13->negativeSuffixPattern);
    if ((((UVar5 == '\0') || (UVar6 == '\0')) || (!bVar4)) || (UVar7 == '\0')) {
      this->fields->canUseFastFormat = false;
    }
    else {
      pDVar13 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                          ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                           this->fields);
      bVar15 = pDVar13->groupingUsed & 1;
      pDVar13 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                          ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                           this->fields);
      iVar1 = pDVar13->groupingSize;
      pDVar14 = LocalPointerBase<const_icu_63::DecimalFormatSymbols>::operator->
                          (&(this->fields->symbols).
                            super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>);
      this_00 = DecimalFormatSymbols::getConstSymbol(pDVar14,kGroupingSeparatorSymbol);
      if ((bVar15 == 0) ||
         ((iVar1 < 1 || iVar1 == 3 && (iVar10 = UnicodeString::length(this_00), iVar10 == 1)))) {
        pDVar13 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                            (&(this->fields->exportedProperties).
                              super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>)
        ;
        iVar2 = pDVar13->minimumIntegerDigits;
        pDVar13 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                            (&(this->fields->exportedProperties).
                              super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>)
        ;
        iVar3 = pDVar13->maximumIntegerDigits;
        if (iVar2 < 0xb) {
          pDVar13 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                              (&(this->fields->exportedProperties).
                                super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>
                              );
          if (pDVar13->minimumFractionDigits < 1) {
            pDVar14 = LocalPointerBase<const_icu_63::DecimalFormatSymbols>::operator->
                                (&(this->fields->symbols).
                                  super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>);
            this_01 = DecimalFormatSymbols::getConstSymbol(pDVar14,kMinusSignSymbol);
            pDVar14 = LocalPointerBase<const_icu_63::DecimalFormatSymbols>::operator->
                                (&(this->fields->symbols).
                                  super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>);
            uVar11 = DecimalFormatSymbols::getCodePointZero(pDVar14);
            iVar10 = UnicodeString::length(this_01);
            if (iVar10 == 1) {
              iVar12 = 2;
              if (uVar11 < 0x10000) {
                iVar12 = 1;
              }
              if (iVar12 == 1) {
                this->fields->canUseFastFormat = true;
                (this->fields->fastData).cpZero = (char16_t)uVar11;
                if ((bVar15 == 0) || (iVar1 != 3)) {
                  cVar9 = L'\0';
                }
                else {
                  cVar9 = UnicodeString::charAt(this_00,0);
                }
                (this->fields->fastData).cpGroupingSeparator = cVar9;
                cVar9 = UnicodeString::charAt(this_01,0);
                (this->fields->fastData).cpMinusSign = cVar9;
                if ((iVar2 < 0) || (0x7f < iVar2)) {
                  iVar8 = '\0';
                }
                else {
                  iVar8 = (int8_t)iVar2;
                }
                (this->fields->fastData).minInt = iVar8;
                if ((iVar3 < 0) || (0x7f < iVar3)) {
                  iVar8 = '\x7f';
                }
                else {
                  iVar8 = (int8_t)iVar3;
                }
                (this->fields->fastData).maxInt = iVar8;
                return;
              }
            }
            this->fields->canUseFastFormat = false;
          }
          else {
            this->fields->canUseFastFormat = false;
          }
        }
        else {
          this->fields->canUseFastFormat = false;
        }
      }
      else {
        this->fields->canUseFastFormat = false;
      }
    }
  }
  else {
    this->fields->canUseFastFormat = false;
  }
  return;
}

Assistant:

void DecimalFormat::setupFastFormat() {
    // Check the majority of properties:
    if (!fields->properties->equalsDefaultExceptFastFormat()) {
        trace("no fast format: equality\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Now check the remaining properties.
    // Nontrivial affixes:
    UBool trivialPP = fields->properties->positivePrefixPattern.isEmpty();
    UBool trivialPS = fields->properties->positiveSuffixPattern.isEmpty();
    UBool trivialNP = fields->properties->negativePrefixPattern.isBogus() || (
            fields->properties->negativePrefixPattern.length() == 1 &&
            fields->properties->negativePrefixPattern.charAt(0) == u'-');
    UBool trivialNS = fields->properties->negativeSuffixPattern.isEmpty();
    if (!trivialPP || !trivialPS || !trivialNP || !trivialNS) {
        trace("no fast format: affixes\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Grouping (secondary grouping is forbidden in equalsDefaultExceptFastFormat):
    bool groupingUsed = fields->properties->groupingUsed;
    int32_t groupingSize = fields->properties->groupingSize;
    bool unusualGroupingSize = groupingSize > 0 && groupingSize != 3;
    const UnicodeString& groupingString = fields->symbols->getConstSymbol(DecimalFormatSymbols::kGroupingSeparatorSymbol);
    if (groupingUsed && (unusualGroupingSize || groupingString.length() != 1)) {
        trace("no fast format: grouping\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Integer length:
    int32_t minInt = fields->exportedProperties->minimumIntegerDigits;
    int32_t maxInt = fields->exportedProperties->maximumIntegerDigits;
    // Fastpath supports up to only 10 digits (length of INT32_MIN)
    if (minInt > 10) {
        trace("no fast format: integer\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Fraction length (no fraction part allowed in fast path):
    int32_t minFrac = fields->exportedProperties->minimumFractionDigits;
    if (minFrac > 0) {
        trace("no fast format: fraction\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Other symbols:
    const UnicodeString& minusSignString = fields->symbols->getConstSymbol(DecimalFormatSymbols::kMinusSignSymbol);
    UChar32 codePointZero = fields->symbols->getCodePointZero();
    if (minusSignString.length() != 1 || U16_LENGTH(codePointZero) != 1) {
        trace("no fast format: symbols\n");
        fields->canUseFastFormat = false;
        return;
    }

    // Good to go!
    trace("can use fast format!\n");
    fields->canUseFastFormat = true;
    fields->fastData.cpZero = static_cast<char16_t>(codePointZero);
    fields->fastData.cpGroupingSeparator = groupingUsed && groupingSize == 3 ? groupingString.charAt(0) : 0;
    fields->fastData.cpMinusSign = minusSignString.charAt(0);
    fields->fastData.minInt = (minInt < 0 || minInt > 127) ? 0 : static_cast<int8_t>(minInt);
    fields->fastData.maxInt = (maxInt < 0 || maxInt > 127) ? 127 : static_cast<int8_t>(maxInt);
}